

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesLongMessageForm.cxx
# Opt level: O3

void __thiscall cmCursesLongMessageForm::UpdateStatusBar(cmCursesLongMessageForm *this)

{
  uint uVar1;
  char *pcVar2;
  size_t sVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  char fmt_s [3];
  char vertmp [128];
  char version [512];
  char bar [512];
  undefined2 local_4bc;
  undefined1 local_4ba;
  char local_4b8 [128];
  char local_438 [512];
  char local_238 [520];
  
  if (_stdscr == 0) {
    iVar6 = -1;
    uVar5 = 0xffffffff;
  }
  else {
    iVar6 = *(short *)(_stdscr + 4) + 1;
    uVar5 = (int)*(short *)(_stdscr + 6) + 1;
  }
  uVar4 = (this->Title)._M_string_length;
  sVar3 = 0x1ff;
  if (uVar4 < 0x1ff) {
    sVar3 = uVar4;
  }
  strncpy(local_238,(this->Title)._M_dataplus._M_p,sVar3);
  memset(local_238 + sVar3,0x20,0x200 - sVar3);
  uVar1 = 0x1ff;
  if (uVar5 < 0x1ff) {
    uVar1 = uVar5;
  }
  uVar4 = (ulong)uVar1;
  local_238[uVar4] = '\0';
  pcVar2 = cmVersion::GetCMakeVersion();
  snprintf(local_4b8,0x80,"CMake Version %s",pcVar2);
  sVar3 = strlen(local_4b8);
  sVar3 = uVar4 - sVar3;
  if (sVar3 != 0) {
    memset(local_438,0x20,sVar3);
  }
  snprintf(local_438 + sVar3,0x200 - sVar3,"%s",local_4b8);
  local_438[uVar4] = '\0';
  local_4ba = 0;
  local_4bc = 0x7325;
  move(iVar6 + -4,0);
  wattr_on(_stdscr,0x10000,0);
  printw(&local_4bc,local_238);
  wattr_off(_stdscr,0x10000,0);
  move(iVar6 + -3,0);
  printw(&local_4bc,local_438);
  pos_form_cursor((this->super_cmCursesForm).Form);
  return;
}

Assistant:

void cmCursesLongMessageForm::UpdateStatusBar()
{
  int x;
  int y;
  getmaxyx(stdscr, y, x);

  char bar[cmCursesMainForm::MAX_WIDTH];
  size_t size = this->Title.size();
  if (size >= cmCursesMainForm::MAX_WIDTH) {
    size = cmCursesMainForm::MAX_WIDTH - 1;
  }
  strncpy(bar, this->Title.c_str(), size);
  for (size_t i = size; i < cmCursesMainForm::MAX_WIDTH; i++) {
    bar[i] = ' ';
  }
  int width;
  if (x >= 0 && x < cmCursesMainForm::MAX_WIDTH) {
    width = x;
  } else {
    width = cmCursesMainForm::MAX_WIDTH - 1;
  }

  bar[width] = '\0';

  char version[cmCursesMainForm::MAX_WIDTH];
  char vertmp[128];
  snprintf(vertmp, sizeof(vertmp), "CMake Version %s",
           cmVersion::GetCMakeVersion());
  size_t sideSpace = (width - strlen(vertmp));
  for (size_t i = 0; i < sideSpace; i++) {
    version[i] = ' ';
  }
  snprintf(version + sideSpace, sizeof(version) - sideSpace, "%s", vertmp);
  version[width] = '\0';

  char fmt_s[] = "%s";
  curses_move(y - 4, 0);
  attron(A_STANDOUT);
  printw(fmt_s, bar);
  attroff(A_STANDOUT);
  curses_move(y - 3, 0);
  printw(fmt_s, version);
  pos_form_cursor(this->Form);
}